

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O0

void Handler_mode_S_Inventory
               (AInventory *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  bool bVar1;
  FName local_3c;
  WORD *local_38;
  FName *pMode;
  char *str;
  FPropParam *params_local;
  Baggage *bag_local;
  PClassActor *info_local;
  AInventory *defaults_local;
  
  pMode = (FName *)params[1].exp;
  str = (char *)params;
  params_local = (FPropParam *)bag;
  bag_local = (Baggage *)info;
  info_local = (PClassActor *)defaults;
  bVar1 = PClass::IsDescendantOf(&info->super_PClass,APowerup::RegistrationInfo.MyClass);
  if (bVar1) {
    local_38 = (WORD *)((long)&info_local[2].Replacee + 4);
  }
  else {
    bVar1 = PClass::IsDescendantOf((PClass *)bag_local,APowerupGiver::RegistrationInfo.MyClass);
    if (!bVar1) {
      I_Error("\"powerup.mode\" requires an actor of type \"Powerup\"\n");
      return;
    }
    local_38 = &info_local[2].ConversationID;
  }
  FName::FName(&local_3c,(char *)pMode);
  FName::operator=((FName *)local_38,&local_3c);
  return;
}

Assistant:

DEFINE_CLASS_PROPERTY_PREFIX(powerup, mode, S, Inventory)
{
	PROP_STRING_PARM(str, 0);
	FName *pMode;
	if (info->IsDescendantOf(RUNTIME_CLASS(APowerup)))
	{
		pMode = &((APowerup*)defaults)->Mode;
	}
	else if (info->IsDescendantOf(RUNTIME_CLASS(APowerupGiver)))
	{
		pMode = &((APowerupGiver*)defaults)->Mode;
	}
	else
	{
		I_Error("\"powerup.mode\" requires an actor of type \"Powerup\"\n");
		return;
	}
	*pMode = (FName)str;
}